

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError Pa_WriteStream(PaStream *stream,void *buffer,unsigned_long frames)

{
  undefined4 local_24;
  PaError result;
  unsigned_long frames_local;
  void *buffer_local;
  PaStream *stream_local;
  
  local_24 = PaUtil_ValidateStreamPointer(stream);
  if (local_24 == 0) {
    if (frames == 0) {
      local_24 = 0;
    }
    else if (buffer == (void *)0x0) {
      local_24 = -0x26f4;
    }
    else {
      local_24 = (**(code **)(*(long *)((long)stream + 0x10) + 0x20))(stream);
      if (local_24 == 0) {
        local_24 = (**(code **)(*(long *)((long)stream + 0x10) + 0x48))(stream,buffer,frames);
      }
      else if (local_24 == 1) {
        local_24 = -0x26ff;
      }
    }
  }
  return local_24;
}

Assistant:

PaError Pa_WriteStream( PaStream* stream,
                        const void *buffer,
                        unsigned long frames )
{
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_WriteStream" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    if( result == paNoError )
    {
        if( frames == 0 )
        {
            /* @todo Should we not allow the implementation to signal any underflow condition? see: http://www.portaudio.com/trac/ticket/116*/
            result = paNoError;
        }
        else if( buffer == 0 )
        {
            result = paBadBufferPtr;
        }
        else
        {
            result = PA_STREAM_INTERFACE(stream)->IsStopped( stream );
            if( result == 0 )
            {
                result = PA_STREAM_INTERFACE(stream)->Write( stream, buffer, frames );
            }
            else if( result == 1 )
            {
                result = paStreamIsStopped;
            }
        }
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_WriteStream", result );

    return result;
}